

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::operator+(Bstrlib *this,uint8 *a,String *b)

{
  uchar *extraout_RDX;
  String SVar1;
  String local_30;
  String *local_20;
  String *b_local;
  uint8 *a_local;
  
  local_20 = b;
  b_local = (String *)a;
  a_local = (uint8 *)this;
  String::String(&local_30,(char *)a);
  String::operator+((String *)this,&local_30);
  String::~String(&local_30);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String operator+(const uint8 * a, const String& b)
    {
        return String((const char *)a) + b;
    }